

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

bool __thiscall
ON_Layer::UpdateReferencedComponents
          (ON_Layer *this,ON_ComponentManifest *source_manifest,
          ON_ComponentManifest *destination_manifest,ON_ManifestMap *manifest_map)

{
  bool bVar1;
  bool bVar2;
  ON_ComponentManifestItem *this_00;
  int *piVar3;
  int *piVar4;
  int destination_material_index;
  undefined1 auStack_44 [12];
  ON_UUID manifest_item_id;
  
  piVar3 = &destination_material_index;
  piVar4 = &destination_material_index;
  if (this->m_material_index < 0) {
    bVar1 = true;
  }
  else {
    destination_material_index = 0x80000001;
    bVar1 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,Material,this->m_material_index,destination_manifest,
                       &destination_material_index);
    if (!bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x6a,"","Unable to update render material reference.");
      piVar3 = &Default.m_material_index;
    }
    SetRenderMaterialIndex(this,*piVar3);
  }
  if (-1 < this->m_linetype_index) {
    destination_material_index = 0x80000001;
    bVar2 = ON_ManifestMap::GetAndValidateDestinationIndex
                      (manifest_map,LinePattern,this->m_linetype_index,destination_manifest,
                       &destination_material_index);
    if (!bVar2) {
      bVar1 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x80,"","Unable to update line pattern reference.");
      piVar4 = &Default.m_linetype_index;
    }
    SetLinetypeIndex(this,*piVar4);
  }
  _destination_material_index = ParentLayerId(this);
  bVar2 = ::operator!=(&ON_nil_uuid,(ON_UUID_struct *)&destination_material_index);
  if (bVar2) {
    this_00 = ON_ComponentManifest::ItemFromId
                        (destination_manifest,Layer,_destination_material_index);
    manifest_item_id = ON_ComponentManifestItem::Id(this_00);
    bVar2 = ::operator==(&ON_nil_uuid,&manifest_item_id);
    if (bVar2) {
      bVar1 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                 ,0x91,"","Unable to update parent layer id reference.");
      _destination_material_index = ParentLayerId(&Default);
    }
    else {
      _destination_material_index = manifest_item_id;
    }
    SetParentLayerId(this,_destination_material_index);
  }
  return bVar1;
}

Assistant:

bool ON_Layer::UpdateReferencedComponents(
  const class ON_ComponentManifest& source_manifest,
  const class ON_ComponentManifest& destination_manifest,
  const class ON_ManifestMap& manifest_map
  )
{
  bool rc = true;

  // Update render material reference
  int material_index = RenderMaterialIndex();
  if (material_index >= 0)
  {
    int destination_material_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(
      ON_ModelComponent::Type::RenderMaterial,
      material_index,
      destination_manifest,
      &destination_material_index))
    {
      material_index = destination_material_index;
    }
    else
    {
      ON_ERROR("Unable to update render material reference.");
      rc = false;
      material_index = ON_Layer::Default.RenderMaterialIndex();
    }
    SetRenderMaterialIndex(material_index);
  }

  // Update line pattern reference
  int line_pattern_index = LinetypeIndex();
  if (line_pattern_index >= 0)
  {
    int destination_line_pattern_index = ON_UNSET_INT_INDEX;
    if (manifest_map.GetAndValidateDestinationIndex(
      ON_ModelComponent::Type::LinePattern,
      line_pattern_index,
      destination_manifest,
      &destination_line_pattern_index))
    {
      line_pattern_index = destination_line_pattern_index;
    }
    else
    {
      ON_ERROR("Unable to update line pattern reference.");
      rc = false;
      line_pattern_index = ON_Layer::Default.LinetypeIndex();
    }
    SetLinetypeIndex(line_pattern_index);
  }

  // Update parent layer reference
  ON_UUID parent_layer_id = ParentLayerId();
  if (ON_nil_uuid != parent_layer_id)
  {
    const ON_UUID manifest_item_id = destination_manifest.ItemFromId(
      ON_ModelComponent::Type::Layer,
      parent_layer_id
      ).Id();
    if ( ON_nil_uuid == manifest_item_id )
    {
      ON_ERROR("Unable to update parent layer id reference.");
      rc = false;
      parent_layer_id = ON_Layer::Default.ParentLayerId();
    }
    else
    {
      parent_layer_id = manifest_item_id;
    }
    SetParentLayerId(parent_layer_id);
  }

  return rc;
}